

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::GenerateMips
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,ITextureView *pTexView)

{
  String *__return_storage_ptr__;
  bool bVar1;
  COMMAND_QUEUE_TYPE CVar2;
  TEXTURE_VIEW_FLAGS TVar3;
  Char *pCVar4;
  RenderPassVkImpl *pRVar5;
  char (*Args) [23];
  COMMAND_QUEUE_TYPE Type;
  char *in_R8;
  char (*in_R9) [8];
  char (*in_stack_fffffffffffffe78) [52];
  undefined1 local_138 [8];
  string msg_6;
  undefined1 local_110 [8];
  string msg_5;
  TextureViewDesc *ViewDesc;
  string msg_4;
  string msg_3;
  undefined1 local_88 [8];
  string msg_2;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  ITextureView *pTexView_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_8_ = pTexView;
  if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
    bVar1 = IsDeferred(this);
    if (!bVar1) {
      FormatString<char[79]>
                ((string *)local_38,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"GenerateMips",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x767);
      std::__cxx11::string::~string((string *)local_38);
    }
    FormatString<char[97]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"GenerateMips",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x767);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  CVar2 = Diligent::operator&((this->m_Desc).QueueType,COMMAND_QUEUE_TYPE_GRAPHICS);
  if (CVar2 != COMMAND_QUEUE_TYPE_GRAPHICS) {
    __return_storage_ptr__ = (String *)((long)&msg_3.field_2 + 8);
    GetCommandQueueTypeString_abi_cxx11_
              (__return_storage_ptr__,(Diligent *)(ulong)(this->m_Desc).QueueType,Type);
    in_R8 = " queue.";
    FormatString<char[13],char[22],std::__cxx11::string,char[8]>
              ((string *)local_88,(Diligent *)"GenerateMips",(char (*) [13])0xf4cb59,
               (char (*) [22])__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"GenerateMips",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x767);
    std::__cxx11::string::~string((string *)local_88);
  }
  if (msg.field_2._8_8_ == 0) {
    FormatString<char[26]>
              ((string *)((long)&msg_4.field_2 + 8),(char (*) [26])"pTexView must not be null");
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"GenerateMips",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x768);
    std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
  }
  pRVar5 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassVkImpl_
                     ((RefCntAutoPtr *)&this->m_pActiveRenderPass);
  if (pRVar5 != (RenderPassVkImpl *)0x0) {
    FormatString<char[58]>
              ((string *)&ViewDesc,
               (char (*) [58])"GenerateMips command must be used outside of render pass.");
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"GenerateMips",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x769);
    std::__cxx11::string::~string((string *)&ViewDesc);
  }
  Args = (char (*) [23])(**(code **)(*(long *)msg.field_2._8_8_ + 0x20))();
  msg_5.field_2._8_8_ = Args;
  if ((*Args)[8] != '\x01') {
    msg_6.field_2._8_8_ = GetTexViewTypeLiteralName((*Args)[8]);
    in_R8 = (char *)((long)&msg_6.field_2 + 8);
    FormatString<char[23],char_const*,char[57],char_const*,char[52]>
              ((string *)local_110,(Diligent *)"Shader resource view \'",Args,
               (char **)"\' can\'t be used to generate mipmaps because its type is ",
               (char (*) [57])in_R8,(char **)". Required view type: TEXTURE_VIEW_SHADER_RESOURCE.",
               in_stack_fffffffffffffe78);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"GenerateMips",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x76e);
    std::__cxx11::string::~string((string *)local_110);
  }
  TVar3 = Diligent::operator&(*(TEXTURE_VIEW_FLAGS *)(msg_5.field_2._8_8_ + 0x1d),
                              TEXTURE_VIEW_FLAG_ALLOW_MIP_MAP_GENERATION);
  if (TVar3 == TEXTURE_VIEW_FLAG_NONE) {
    FormatString<char[23],char_const*,char[110]>
              ((string *)local_138,(Diligent *)"Shader resource view \'",
               (char (*) [23])msg_5.field_2._8_8_,
               (char **)
               "\' was not created with TEXTURE_VIEW_FLAG_ALLOW_MIP_MAP_GENERATION flag and can\'t be used to generate mipmaps."
               ,(char (*) [110])in_R8);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"GenerateMips",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x770);
    std::__cxx11::string::~string((string *)local_138);
  }
  (this->m_Stats).CommandCounters.GenerateMips = (this->m_Stats).CommandCounters.GenerateMips + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::GenerateMips(ITextureView* pTexView)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "GenerateMips");
    DEV_CHECK_ERR(pTexView != nullptr, "pTexView must not be null");
    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr, "GenerateMips command must be used outside of render pass.");
#ifdef DILIGENT_DEVELOPMENT
    {
        const TextureViewDesc& ViewDesc = pTexView->GetDesc();
        DEV_CHECK_ERR(ViewDesc.ViewType == TEXTURE_VIEW_SHADER_RESOURCE, "Shader resource view '", ViewDesc.Name,
                      "' can't be used to generate mipmaps because its type is ", GetTexViewTypeLiteralName(ViewDesc.ViewType), ". Required view type: TEXTURE_VIEW_SHADER_RESOURCE.");
        DEV_CHECK_ERR((ViewDesc.Flags & TEXTURE_VIEW_FLAG_ALLOW_MIP_MAP_GENERATION) != 0, "Shader resource view '", ViewDesc.Name,
                      "' was not created with TEXTURE_VIEW_FLAG_ALLOW_MIP_MAP_GENERATION flag and can't be used to generate mipmaps.");
    }
#endif
    ++m_Stats.CommandCounters.GenerateMips;
}